

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::copyAppend
          (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this,HistoryEntry *b,HistoryEntry *e
          )

{
  HistoryEntry *pHVar1;
  Data *pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  HistoryEntry *this_00;
  
  if ((b != e) && (b < e)) {
    pHVar1 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).ptr;
    lVar6 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
    do {
      this_00 = pHVar1 + lVar6;
      QUrl::QUrl(&this_00->url,&b->url);
      pDVar2 = (b->title).d.d;
      pHVar1[lVar6].title.d.d = pDVar2;
      pHVar1[lVar6].title.d.ptr = (b->title).d.ptr;
      pHVar1[lVar6].title.d.size = (b->title).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this_00->type = b->type;
      iVar3 = b->vpos;
      iVar4 = b->focusIndicatorPosition;
      iVar5 = b->focusIndicatorAnchor;
      this_00->hpos = b->hpos;
      this_00->vpos = iVar3;
      this_00->focusIndicatorPosition = iVar4;
      this_00->focusIndicatorAnchor = iVar5;
      b = b + 1;
      lVar6 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size + 1;
      (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size = lVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }